

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O0

int pkey_gost_ec_ctrl_str_common(EVP_PKEY_CTX *ctx,char *type,char *value)

{
  int iVar1;
  char *in_RDX;
  char *in_RSI;
  int vko_dgst_nid;
  int bits;
  long len;
  uchar *tmp;
  uchar ukm_buf [32];
  char *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  size_t local_58;
  void *local_50;
  void *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  EVP_PKEY_CTX *in_stack_ffffffffffffffc8;
  int local_4;
  
  iVar1 = strcmp(in_RSI,"ukmhex");
  if (iVar1 == 0) {
    local_50 = (void *)0x0;
    local_58 = 0;
    local_50 = (void *)OPENSSL_hexstr2buf(in_RDX,&local_58);
    if (local_50 == (void *)0x0) {
      local_4 = 0;
    }
    else if ((long)local_58 < 0x21) {
      memcpy(&stack0xffffffffffffffb8,local_50,local_58);
      CRYPTO_free(local_50);
      local_4 = pkey_gost_ctrl(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                               in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    else {
      CRYPTO_free(local_50);
      ERR_GOST_error(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0
                    );
      local_4 = 0;
    }
  }
  else {
    iVar1 = strcmp(in_RSI,"vko");
    if (iVar1 == 0) {
      iVar1 = atoi(in_RDX);
      if (((iVar1 == 0x100) || (iVar1 == 0x200)) || (iVar1 == 0)) {
        local_4 = pkey_gost_ctrl(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                                 in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      else {
        ERR_GOST_error(iVar1,0,in_stack_ffffffffffffff98,0);
        local_4 = 0;
      }
    }
    else {
      local_4 = -2;
    }
  }
  return local_4;
}

Assistant:

static int pkey_gost_ec_ctrl_str_common(EVP_PKEY_CTX *ctx,
                                     const char *type, const char *value)
{
  if (0 == strcmp(type, ukm_ctrl_string)) {
    unsigned char ukm_buf[32], *tmp = NULL;
    long len = 0;
    tmp = OPENSSL_hexstr2buf(value, &len);
    if (tmp == NULL)
      return 0;

    if (len > 32) {
      OPENSSL_free(tmp);
      GOSTerr(GOST_F_PKEY_GOST_EC_CTRL_STR_COMMON, GOST_R_CTRL_CALL_FAILED);
      return 0;
    }
    memcpy(ukm_buf, tmp, len);
    OPENSSL_free(tmp);

    return pkey_gost_ctrl(ctx, EVP_PKEY_CTRL_SET_IV, len, ukm_buf);
  } else if (strcmp(type, vko_ctrl_string) == 0) {
      int bits = atoi(value);
      int vko_dgst_nid = 0;

      if (bits == 256)
	  vko_dgst_nid = NID_id_GostR3411_2012_256;
      else if (bits == 512)
	  vko_dgst_nid = NID_id_GostR3411_2012_512;
      else if (bits != 0) {
	  GOSTerr(GOST_F_PKEY_GOST_EC_CTRL_STR_COMMON, GOST_R_INVALID_DIGEST_TYPE);
	  return 0;
      }
      return pkey_gost_ctrl(ctx, EVP_PKEY_CTRL_SET_VKO, vko_dgst_nid, NULL);
  }
  return -2;
}